

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::SetOneofIndexBase
          (FieldGeneratorMap *this,int index_base)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < *(int *)(this->descriptor_ + 0x68); lVar1 = lVar1 + 1) {
    FieldGenerator::SetOneofIndexBase
              ((FieldGenerator *)
               (this->field_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ._M_t,index_base);
  }
  return;
}

Assistant:

void FieldGeneratorMap::SetOneofIndexBase(int index_base) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_[i]->SetOneofIndexBase(index_base);
  }
}